

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CreateTokenizer(fts5_api *pApi,char *zName,void *pUserData,fts5_tokenizer *pTokenizer,
                       _func_void_void_ptr *xDestroy)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  Fts5TokenizerModule *pNew;
  Fts5TokenizerModule *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (Fts5TokenizerModule *)0x0;
  iVar4 = fts5NewTokenizerModule((Fts5Global *)pApi,zName,pUserData,xDestroy,&local_20);
  if (local_20 != (Fts5TokenizerModule *)0x0) {
    (local_20->x1).xTokenize = pTokenizer->xTokenize;
    uVar1 = *(undefined4 *)((long)&pTokenizer->xCreate + 4);
    uVar2 = *(undefined4 *)&pTokenizer->xDelete;
    uVar3 = *(undefined4 *)((long)&pTokenizer->xDelete + 4);
    *(undefined4 *)&(local_20->x1).xCreate = *(undefined4 *)&pTokenizer->xCreate;
    *(undefined4 *)((long)&(local_20->x1).xCreate + 4) = uVar1;
    *(undefined4 *)&(local_20->x1).xDelete = uVar2;
    *(undefined4 *)((long)&(local_20->x1).xDelete + 4) = uVar3;
    (local_20->x2).xCreate = fts5VtoVCreate;
    (local_20->x2).xTokenize = fts5V2toV1Tokenize;
    (local_20->x2).xDelete = fts5VtoVDelete;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5CreateTokenizer(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  fts5_tokenizer *pTokenizer,     /* Tokenizer implementation */
  void(*xDestroy)(void*)          /* Destructor for pUserData */
){
  Fts5TokenizerModule *pNew = 0;
  int rc = SQLITE_OK;

  rc = fts5NewTokenizerModule(
      (Fts5Global*)pApi, zName, pUserData, xDestroy, &pNew
  );
  if( pNew ){
    pNew->x1 = *pTokenizer;
    pNew->x2.xCreate = fts5VtoVCreate;
    pNew->x2.xTokenize = fts5V2toV1Tokenize;
    pNew->x2.xDelete = fts5VtoVDelete;
  }
  return rc;
}